

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void prvTidyFixLanguageInformation(TidyDocImpl *doc,Node *node,Bool wantXmlLang,Bool wantLang)

{
  Node **ppNVar1;
  Node *pNVar2;
  Bool BVar3;
  uint uVar4;
  AttVal *attr;
  AttVal *attr_00;
  
  do {
    if (node == (Node *)0x0) {
      return;
    }
    pNVar2 = node->next;
    BVar3 = prvTidynodeIsElement(node);
    if (BVar3 != no) {
      attr = prvTidyAttrGetById(node,TidyAttr_LANG);
      attr_00 = prvTidyAttrGetById(node,TidyAttr_XML_LANG);
      if (attr == (AttVal *)0x0 || attr_00 == (AttVal *)0x0) {
        if (wantXmlLang != no && attr != (AttVal *)0x0) {
          uVar4 = prvTidyNodeAttributeVersions(node,TidyAttr_XML_LANG);
          if ((doc->lexer->versionEmitted & uVar4) != 0) {
            prvTidyRepairAttrValue(doc,node,"xml:lang",attr->value);
          }
          goto LAB_0014ce23;
        }
        if (wantLang == no || attr_00 == (AttVal *)0x0) goto LAB_0014ce23;
        uVar4 = prvTidyNodeAttributeVersions(node,TidyAttr_LANG);
        if ((doc->lexer->versionEmitted & uVar4) != 0) {
          prvTidyRepairAttrValue(doc,node,"lang",attr_00->value);
        }
      }
      else {
LAB_0014ce23:
        if (attr != (AttVal *)0x0 && wantLang == no) {
          prvTidyRemoveAttribute(doc,node,attr);
        }
      }
      if (attr_00 != (AttVal *)0x0 && wantXmlLang == no) {
        prvTidyRemoveAttribute(doc,node,attr_00);
      }
    }
    ppNVar1 = &node->content;
    node = pNVar2;
    if (*ppNVar1 != (Node *)0x0) {
      prvTidyFixLanguageInformation(doc,*ppNVar1,wantXmlLang,wantLang);
    }
  } while( true );
}

Assistant:

void TY_(FixLanguageInformation)(TidyDocImpl* doc, Node* node, Bool wantXmlLang, Bool wantLang)
{
    Node* next;

    while (node)
    {
        next = node->next;

        /* todo: report modifications made here to the report system */

        if (TY_(nodeIsElement)(node))
        {
            AttVal* lang = TY_(AttrGetById)(node, TidyAttr_LANG);
            AttVal* xmlLang = TY_(AttrGetById)(node, TidyAttr_XML_LANG);

            if (lang && xmlLang)
            {
                /*
                  todo: check whether both attributes are in sync,
                  here or elsewhere, where elsewhere is probably
                  preferable.
                  AD - March 2005: not mandatory according the standards.
                */
            }
            else if (lang && wantXmlLang)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_XML_LANG )
                    & doc->lexer->versionEmitted)
                    TY_(RepairAttrValue)(doc, node, "xml:lang", lang->value);
            }
            else if (xmlLang && wantLang)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_LANG )
                    & doc->lexer->versionEmitted)
                    TY_(RepairAttrValue)(doc, node, "lang", xmlLang->value);
            }

            if (lang && !wantLang)
                TY_(RemoveAttribute)(doc, node, lang);
            
            if (xmlLang && !wantXmlLang)
                TY_(RemoveAttribute)(doc, node, xmlLang);
        }

        if (node->content)
            TY_(FixLanguageInformation)(doc, node->content, wantXmlLang, wantLang);

        node = next;
    }
}